

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  pointer pBVar4;
  int *piVar5;
  Allocator *pAVar6;
  pointer pMVar7;
  long *plVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar10;
  undefined4 extraout_var_01;
  Layer *pLVar11;
  undefined4 extraout_var_02;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar12;
  Mat *pMVar13;
  int iVar14;
  size_t *psVar15;
  long lVar16;
  void *pvVar17;
  int iVar18;
  int iVar19;
  Net *pNVar20;
  long lVar21;
  size_t sVar22;
  int *piVar23;
  int top_count;
  int bottom_count;
  int blob_count;
  int layer_count;
  ParamDict pd;
  int magic;
  Option opt1;
  char bottom_name [256];
  char layer_type [256];
  char layer_name [256];
  int local_41c;
  Net *local_418;
  Layer *local_410;
  int local_408;
  char local_401;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_400;
  long local_3f8;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  ulong local_3e0;
  vector<int,_std::allocator<int>_> *local_3d8;
  vector<int,_std::allocator<int>_> *local_3d0;
  DataReader *local_3c8;
  ParamDict local_3c0;
  int local_3ac;
  undefined1 local_3a8 [32];
  Allocator *local_388;
  int iStack_380;
  int local_37c;
  int iStack_378;
  undefined8 uStack_374;
  size_t local_368;
  Option *local_358;
  Mat *local_350;
  string *local_348;
  string *local_340;
  Mat local_338 [3];
  char local_238 [256];
  char local_138 [264];
  
  local_3ac = 0;
  iVar9 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar9 == 1) {
    if (local_3ac == 0x7685dd) {
      local_3e4 = 0;
      local_3e8 = 0;
      iVar9 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar9 == 1) {
        iVar9 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_3e8);
        if (iVar9 == 1) {
          if ((0 < (long)local_3e4) && (0 < local_3e8)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)local_3e4);
            local_418 = this;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)local_3e8);
            ParamDict::ParamDict(&local_3c0);
            if (0 < local_3e4) {
              local_358 = &local_418->opt;
              local_3f8 = 0;
              local_3e0 = 0;
              local_3c8 = dr;
              do {
                psVar15 = &local_338[0].elemsize;
                local_408 = 0;
                local_41c = 0;
                iVar9 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_238);
                if (iVar9 != 1) {
                  load_param();
LAB_001352ac:
                  iVar9 = -1;
                  goto LAB_001352b1;
                }
                iVar9 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_138);
                if (iVar9 != 1) {
                  load_param();
                  goto LAB_001352ac;
                }
                iVar9 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_408);
                if (iVar9 != 1) {
                  load_param();
                  goto LAB_001352ac;
                }
                iVar9 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_41c);
                if (iVar9 != 1) {
                  load_param();
                  goto LAB_001352ac;
                }
                iVar9 = (*local_418->_vptr_Net[4])(local_418,local_238);
                local_410 = (Layer *)CONCAT44(extraout_var,iVar9);
                if ((local_410 == (Layer *)0x0) &&
                   (local_410 = create_layer_cpu(local_238), local_410 == (Layer *)0x0)) {
                  iVar9 = (*local_418->_vptr_Net[3])(local_418,local_238);
                  local_410 = (Layer *)CONCAT44(extraout_var_00,iVar9);
                  if (local_410 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %s not exists or registered",local_238);
                    fputc(10,_stderr);
                    clear(local_418);
                    goto LAB_001352ac;
                  }
                }
                local_338[0].data = psVar15;
                sVar10 = strlen(local_238);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_338,local_238,local_238 + sVar10);
                local_340 = &local_410->type;
                std::__cxx11::string::operator=((string *)local_340,(string *)local_338);
                if ((size_t *)local_338[0].data != psVar15) {
                  operator_delete(local_338[0].data,local_338[0].elemsize + 1);
                }
                local_338[0].data = psVar15;
                sVar10 = strlen(local_138);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_338,local_138,local_138 + sVar10);
                local_348 = &local_410->name;
                std::__cxx11::string::operator=((string *)local_348,(string *)local_338);
                if ((size_t *)local_338[0].data != psVar15) {
                  operator_delete(local_338[0].data,local_338[0].elemsize + 1);
                }
                local_3d0 = &local_410->bottoms;
                std::vector<int,_std::allocator<int>_>::resize(local_3d0,(long)local_408);
                if (0 < local_408) {
                  lVar16 = 0;
                  do {
                    iVar9 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_338);
                    pNVar20 = local_418;
                    if (iVar9 != 1) {
                      load_param();
                      goto LAB_001352ac;
                    }
                    iVar9 = find_blob_index_by_name(local_418,(char *)local_338);
                    if (iVar9 == -1) {
                      pBVar4 = (pNVar20->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      local_3a8._0_8_ = local_3a8 + 0x10;
                      sVar10 = strlen((char *)local_338);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_3a8,local_338,(long)&local_338[0].data + sVar10);
                      lVar21 = (long)(int)local_3e0;
                      std::__cxx11::string::operator=
                                ((string *)(pBVar4 + lVar21),(string *)local_3a8);
                      if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
                        operator_delete((void *)local_3a8._0_8_,
                                        CONCAT44(local_3a8._20_4_,local_3a8._16_4_) + 1);
                      }
                      iVar9 = (int)local_3e0;
                      local_3e0 = (ulong)(iVar9 + 1);
                    }
                    else {
                      lVar21 = (long)iVar9;
                    }
                    (local_418->d->blobs).
                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar21].consumer = (int)local_3f8;
                    (local_3d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar16] = iVar9;
                    lVar16 = lVar16 + 1;
                    dr = local_3c8;
                  } while (lVar16 < local_408);
                }
                local_3d8 = &local_410->tops;
                std::vector<int,_std::allocator<int>_>::resize(local_3d8,(long)local_41c);
                if (0 < local_41c) {
                  lVar16 = (long)(int)local_3e0 * 0x70;
                  local_400 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                              (local_3e0 & 0xffffffff);
                  lVar21 = 0;
                  do {
                    pBVar4 = (local_418->d->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    iVar9 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_338);
                    if (iVar9 != 1) {
                      load_param();
                      goto LAB_001352ac;
                    }
                    local_3a8._0_8_ = local_3a8 + 0x10;
                    sVar10 = strlen((char *)local_338);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_3a8,local_338,(long)&local_338[0].data + sVar10);
                    std::__cxx11::string::operator=
                              ((string *)((long)&(pBVar4->name)._M_dataplus._M_p + lVar16),
                               (string *)local_3a8);
                    if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
                      operator_delete((void *)local_3a8._0_8_,
                                      CONCAT44(local_3a8._20_4_,local_3a8._16_4_) + 1);
                    }
                    *(int *)((long)&pBVar4->producer + lVar16) = (int)local_3f8;
                    (local_3d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar21] = (int)local_400 + (int)lVar21;
                    lVar21 = lVar21 + 1;
                    lVar16 = lVar16 + 0x70;
                    dr = local_3c8;
                  } while (lVar21 < local_41c);
                  local_3e0 = (ulong)(uint)((int)local_3e0 + (int)lVar21);
                }
                bVar2 = local_410->support_vulkan;
                iVar9 = ParamDict::load_param(&local_3c0,dr);
                if (iVar9 == 0) {
                  local_368 = 0;
                  local_3a8._0_8_ = (undefined1 *)0x0;
                  local_3a8._8_4_ = 0;
                  local_3a8._12_4_ = 0;
                  local_3a8._16_4_ = 0;
                  local_3a8._20_4_ = 0;
                  local_3a8._24_4_ = 0;
                  iStack_378 = 0;
                  uStack_374._0_4_ = 0;
                  uStack_374._4_4_ = 0;
                  local_388 = (Allocator *)0x0;
                  iStack_380 = 0;
                  local_37c = 0;
                  ParamDict::get(local_338,&local_3c0,0x1e,(Mat *)local_3a8);
                  piVar23 = (int *)CONCAT44(local_3a8._12_4_,local_3a8._8_4_);
                  if (piVar23 != (int *)0x0) {
                    LOCK();
                    *piVar23 = *piVar23 + -1;
                    UNLOCK();
                    if (*piVar23 == 0) {
                      if (local_388 == (Allocator *)0x0) {
                        if ((undefined1 *)local_3a8._0_8_ != (undefined1 *)0x0) {
                          free((void *)local_3a8._0_8_);
                        }
                      }
                      else {
                        (*local_388->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_401 = bVar2;
                  if ((((size_t *)local_338[0].data != (size_t *)0x0) &&
                      ((long)local_338[0].c * local_338[0].cstep != 0)) && (0 < local_41c)) {
                    piVar23 = (int *)((long)local_338[0].data + 0xc);
                    lVar16 = 0;
                    do {
                      iVar9 = (local_3d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar16];
                      pBVar4 = (local_418->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      iVar3 = piVar23[-3];
                      if (iVar3 == 3) {
                        pvVar12 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(long)piVar23[-2]
                        ;
                        iVar14 = piVar23[-1];
                        iVar19 = *piVar23;
                        sVar22 = (long)iVar14 * (long)pvVar12 + 3U & 0x3ffffffffffffffc;
                        pMVar13 = &pBVar4[iVar9].shape;
                        piVar5 = pBVar4[iVar9].shape.refcount;
                        iVar18 = 3;
                        if (piVar5 != (int *)0x0) {
                          LOCK();
                          *piVar5 = *piVar5 + -1;
                          UNLOCK();
                          if (*piVar5 == 0) {
                            pvVar17 = pBVar4[iVar9].shape.data;
                            pAVar6 = pBVar4[iVar9].shape.allocator;
                            if (pAVar6 == (Allocator *)0x0) {
LAB_00134ce5:
                              pMVar13 = &pBVar4[iVar9].shape;
                              if (pvVar17 != (void *)0x0) {
                                local_400 = pvVar12;
                                local_3ec = iVar19;
                                local_350 = &pBVar4[iVar9].shape;
                                free(pvVar17);
                                pvVar12 = local_400;
                                pMVar13 = local_350;
                                iVar19 = local_3ec;
                                iVar18 = iVar3;
                              }
                            }
                            else {
                              local_400 = pvVar12;
                              local_3ec = iVar19;
                              (*pAVar6->_vptr_Allocator[3])();
                              iVar18 = 3;
                              pvVar12 = local_400;
                              iVar19 = local_3ec;
                            }
                          }
                        }
LAB_00134d19:
                        pMVar13->data = (void *)0x0;
                        pMVar13->refcount = (int *)0x0;
                        pBVar4[iVar9].shape.elemsize = 4;
                        pBVar4[iVar9].shape.elempack = 1;
                        pBVar4[iVar9].shape.allocator = (Allocator *)0x0;
                        pBVar4[iVar9].shape.dims = iVar18;
                        pBVar4[iVar9].shape.w = (int)pvVar12;
                        pBVar4[iVar9].shape.h = iVar14;
                        pBVar4[iVar9].shape.d = 1;
                        pBVar4[iVar9].shape.c = iVar19;
                        pBVar4[iVar9].shape.cstep = sVar22;
                      }
                      else {
                        if (iVar3 == 2) {
                          pvVar12 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                    (long)piVar23[-2];
                          iVar14 = piVar23[-1];
                          sVar22 = (long)iVar14 * (long)pvVar12;
                          pMVar13 = &pBVar4[iVar9].shape;
                          piVar5 = pBVar4[iVar9].shape.refcount;
                          iVar19 = 1;
                          iVar18 = 2;
                          if (piVar5 != (int *)0x0) {
                            LOCK();
                            *piVar5 = *piVar5 + -1;
                            UNLOCK();
                            if (*piVar5 == 0) {
                              pvVar17 = pBVar4[iVar9].shape.data;
                              pAVar6 = pBVar4[iVar9].shape.allocator;
                              if (pAVar6 == (Allocator *)0x0) goto LAB_00134ce5;
                              local_400 = pvVar12;
                              (*pAVar6->_vptr_Allocator[3])();
                              iVar18 = 2;
                              pvVar12 = local_400;
                              iVar19 = 1;
                            }
                          }
                          goto LAB_00134d19;
                        }
                        if (iVar3 == 1) {
                          pvVar12 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                    (ulong)(uint)piVar23[-2];
                          sVar22 = (size_t)piVar23[-2];
                          pMVar13 = &pBVar4[iVar9].shape;
                          piVar5 = pBVar4[iVar9].shape.refcount;
                          iVar18 = 1;
                          if (piVar5 != (int *)0x0) {
                            LOCK();
                            *piVar5 = *piVar5 + -1;
                            UNLOCK();
                            if (*piVar5 == 0) {
                              pvVar17 = pBVar4[iVar9].shape.data;
                              pAVar6 = pBVar4[iVar9].shape.allocator;
                              if (pAVar6 == (Allocator *)0x0) {
                                iVar14 = 1;
                                iVar19 = 1;
                                goto LAB_00134ce5;
                              }
                              (*pAVar6->_vptr_Allocator[3])();
                              iVar14 = 1;
                              iVar19 = 1;
                              iVar18 = 1;
                              goto LAB_00134d19;
                            }
                          }
                          iVar14 = 1;
                          iVar19 = 1;
                          goto LAB_00134d19;
                        }
                      }
                      lVar16 = lVar16 + 1;
                      piVar23 = piVar23 + 4;
                    } while (lVar16 < local_41c);
                  }
                  local_400 = &local_410->bottom_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                            (local_400,(long)local_408);
                  pNVar20 = local_418;
                  if (0 < local_408) {
                    lVar16 = 0;
                    lVar21 = 0;
                    pvVar12 = local_400;
                    iVar9 = local_408;
                    do {
                      iVar3 = (local_3d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar21];
                      pBVar4 = (pNVar20->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar7 = (pvVar12->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar1 = (undefined8 *)((long)&pMVar7->data + lVar16);
                      if ((Mat *)puVar1 != &pBVar4[iVar3].shape) {
                        piVar23 = pBVar4[iVar3].shape.refcount;
                        if (piVar23 != (int *)0x0) {
                          LOCK();
                          *piVar23 = *piVar23 + 1;
                          UNLOCK();
                        }
                        piVar23 = *(int **)((long)&pMVar7->refcount + lVar16);
                        if (piVar23 != (int *)0x0) {
                          LOCK();
                          *piVar23 = *piVar23 + -1;
                          UNLOCK();
                          if (*piVar23 == 0) {
                            pvVar17 = *(void **)((long)&pMVar7->data + lVar16);
                            plVar8 = *(long **)((long)&pMVar7->allocator + lVar16);
                            if (plVar8 == (long *)0x0) {
                              pvVar12 = local_400;
                              if (pvVar17 != (void *)0x0) {
                                free(pvVar17);
                                pvVar12 = local_400;
                              }
                            }
                            else {
                              (**(code **)(*plVar8 + 0x18))();
                              pvVar12 = local_400;
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar7->cstep + lVar16) = 0;
                        *(undefined8 *)((long)puVar1 + 0xc) = 0;
                        *(undefined8 *)((long)puVar1 + 0x14) = 0;
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        puVar1 = (undefined8 *)((long)&pMVar7->dims + lVar16);
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        *(undefined4 *)((long)&pMVar7->c + lVar16) = 0;
                        piVar23 = pBVar4[iVar3].shape.refcount;
                        puVar1 = (undefined8 *)((long)&pMVar7->data + lVar16);
                        *puVar1 = pBVar4[iVar3].shape.data;
                        puVar1[1] = piVar23;
                        *(size_t *)((long)&pMVar7->elemsize + lVar16) = pBVar4[iVar3].shape.elemsize
                        ;
                        *(int *)((long)&pMVar7->elempack + lVar16) = pBVar4[iVar3].shape.elempack;
                        *(Allocator **)((long)&pMVar7->allocator + lVar16) =
                             pBVar4[iVar3].shape.allocator;
                        iVar9 = pBVar4[iVar3].shape.w;
                        iVar14 = pBVar4[iVar3].shape.h;
                        iVar19 = pBVar4[iVar3].shape.d;
                        piVar23 = (int *)((long)&pMVar7->dims + lVar16);
                        *piVar23 = pBVar4[iVar3].shape.dims;
                        piVar23[1] = iVar9;
                        piVar23[2] = iVar14;
                        piVar23[3] = iVar19;
                        *(int *)((long)&pMVar7->c + lVar16) = pBVar4[iVar3].shape.c;
                        *(size_t *)((long)&pMVar7->cstep + lVar16) = pBVar4[iVar3].shape.cstep;
                        iVar9 = local_408;
                      }
                      lVar21 = lVar21 + 1;
                      lVar16 = lVar16 + 0x48;
                    } while (lVar21 < iVar9);
                  }
                  pvVar12 = &local_410->top_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                            (pvVar12,(long)local_41c);
                  if (0 < local_41c) {
                    lVar16 = 0;
                    lVar21 = 0;
                    iVar9 = local_41c;
                    do {
                      iVar3 = (local_3d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar21];
                      pBVar4 = (pNVar20->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar7 = (pvVar12->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar1 = (undefined8 *)((long)&pMVar7->data + lVar16);
                      if ((Mat *)puVar1 != &pBVar4[iVar3].shape) {
                        piVar23 = pBVar4[iVar3].shape.refcount;
                        if (piVar23 != (int *)0x0) {
                          LOCK();
                          *piVar23 = *piVar23 + 1;
                          UNLOCK();
                        }
                        piVar23 = *(int **)((long)&pMVar7->refcount + lVar16);
                        if (piVar23 != (int *)0x0) {
                          LOCK();
                          *piVar23 = *piVar23 + -1;
                          UNLOCK();
                          if (*piVar23 == 0) {
                            pvVar17 = *(void **)((long)&pMVar7->data + lVar16);
                            plVar8 = *(long **)((long)&pMVar7->allocator + lVar16);
                            if (plVar8 == (long *)0x0) {
                              if (pvVar17 != (void *)0x0) {
                                free(pvVar17);
                              }
                            }
                            else {
                              (**(code **)(*plVar8 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar7->cstep + lVar16) = 0;
                        *(undefined8 *)((long)puVar1 + 0xc) = 0;
                        *(undefined8 *)((long)puVar1 + 0x14) = 0;
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        puVar1 = (undefined8 *)((long)&pMVar7->dims + lVar16);
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        *(undefined4 *)((long)&pMVar7->c + lVar16) = 0;
                        piVar23 = pBVar4[iVar3].shape.refcount;
                        puVar1 = (undefined8 *)((long)&pMVar7->data + lVar16);
                        *puVar1 = pBVar4[iVar3].shape.data;
                        puVar1[1] = piVar23;
                        *(size_t *)((long)&pMVar7->elemsize + lVar16) = pBVar4[iVar3].shape.elemsize
                        ;
                        *(int *)((long)&pMVar7->elempack + lVar16) = pBVar4[iVar3].shape.elempack;
                        *(Allocator **)((long)&pMVar7->allocator + lVar16) =
                             pBVar4[iVar3].shape.allocator;
                        iVar9 = pBVar4[iVar3].shape.w;
                        iVar14 = pBVar4[iVar3].shape.h;
                        iVar19 = pBVar4[iVar3].shape.d;
                        piVar23 = (int *)((long)&pMVar7->dims + lVar16);
                        *piVar23 = pBVar4[iVar3].shape.dims;
                        piVar23[1] = iVar9;
                        piVar23[2] = iVar14;
                        piVar23[3] = iVar19;
                        *(int *)((long)&pMVar7->c + lVar16) = pBVar4[iVar3].shape.c;
                        *(size_t *)((long)&pMVar7->cstep + lVar16) = pBVar4[iVar3].shape.cstep;
                        iVar9 = local_41c;
                      }
                      lVar21 = lVar21 + 1;
                      lVar16 = lVar16 + 0x48;
                      pNVar20 = local_418;
                    } while (lVar21 < iVar9);
                  }
                  iVar9 = ParamDict::get(&local_3c0,0x1f,0);
                  local_410->featmask = iVar9;
                  iVar9 = (*local_410->_vptr_Layer[2])(local_410,&local_3c0);
                  dr = local_3c8;
                  pLVar11 = local_410;
                  if (iVar9 == 0) {
                    if (local_410->support_int8_storage == true) {
                      (local_418->opt).use_vulkan_compute = false;
                    }
                    get_masked_option((Option *)local_3a8,local_358,local_410->featmask);
                    if ((local_401 != '\0') &&
                       ((pLVar11->support_vulkan != true ||
                        (pLVar11 = local_410, local_3a8[0x1f] == false)))) {
                      iVar9 = (*local_418->_vptr_Net[4])(local_418,local_238);
                      pLVar11 = (Layer *)CONCAT44(extraout_var_01,iVar9);
                      if ((pLVar11 == (Layer *)0x0) &&
                         (pLVar11 = create_layer_cpu(local_238), pLVar11 == (Layer *)0x0)) {
                        iVar9 = (*local_418->_vptr_Net[3])(local_418,local_238);
                        pLVar11 = (Layer *)CONCAT44(extraout_var_02,iVar9);
                        if (pLVar11 == (Layer *)0x0) {
                          fprintf(_stderr,"layer %s not exists or registered",local_238);
                          fputc(10,_stderr);
                          iVar9 = 1;
                          clear(local_418);
                          goto LAB_0013514f;
                        }
                      }
                      std::__cxx11::string::_M_assign((string *)&pLVar11->type);
                      std::__cxx11::string::_M_assign((string *)&pLVar11->name);
                      std::vector<int,_std::allocator<int>_>::operator=(&pLVar11->bottoms,local_3d0)
                      ;
                      std::vector<int,_std::allocator<int>_>::operator=(&pLVar11->tops,local_3d8);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                                (&pLVar11->bottom_shapes,local_400);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                                (&pLVar11->top_shapes,pvVar12);
                      pLVar11->featmask = local_410->featmask;
                      iVar9 = (*pLVar11->_vptr_Layer[2])(pLVar11,&local_3c0);
                      if (iVar9 != 0) {
                        load_param();
                        iVar9 = 0xe;
                        goto LAB_0013514f;
                      }
                      (*local_410->_vptr_Layer[1])();
                    }
                    (local_418->d->layers).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[local_3f8] = pLVar11;
                    iVar9 = 0;
                  }
                  else {
                    load_param();
                    iVar9 = 0xe;
                  }
LAB_0013514f:
                  if (local_338[0].refcount != (int *)0x0) {
                    LOCK();
                    *local_338[0].refcount = *local_338[0].refcount + -1;
                    UNLOCK();
                    if (*local_338[0].refcount == 0) {
                      if (local_338[0].allocator == (Allocator *)0x0) {
                        if ((size_t *)local_338[0].data != (size_t *)0x0) {
                          free(local_338[0].data);
                        }
                      }
                      else {
                        (*(local_338[0].allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if ((iVar9 != 0xe) && (iVar9 != 0)) goto LAB_001352ac;
                }
                else {
                  fprintf(_stderr,"ParamDict load_param %d %s failed",local_3f8,local_138);
                  fputc(10,_stderr);
                }
                local_3f8 = local_3f8 + 1;
              } while (local_3f8 < local_3e4);
            }
            pNVar20 = local_418;
            NetPrivate::update_input_output_indexes(local_418->d);
            iVar9 = 0;
            NetPrivate::update_input_output_names(pNVar20->d);
LAB_001352b1:
            ParamDict::~ParamDict(&local_3c0);
            return iVar9;
          }
          load_param();
        }
        else {
          load_param();
        }
      }
      else {
        load_param();
      }
    }
    else {
      load_param();
    }
  }
  else {
    load_param();
  }
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev)
        {
            int device_index = opt.vulkan_device_index;
            if (device_index < 0 || device_index >= get_gpu_count())
                device_index = get_default_gpu_index();

            d->vkdev = get_gpu_device(device_index);
        }
        if (!d->vkdev || !d->vkdev->is_valid()) opt.use_vulkan_compute = false; // no valid vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_uniform()) opt.use_fp16_uniform = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_packed()) opt.use_int8_packed = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_uniform()) opt.use_int8_uniform = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;
        if (!d->vkdev->info.support_subgroup_ops()) opt.use_subgroup_ops = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        if (opt.use_image_storage && !d->vkdev->info.support_fp16_image())
        {
            opt.use_fp16_storage = false;
            opt.use_fp16_uniform = false;
        }

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;

        // fp16 uniform makes no sense when fp16 arithmetic disabled
        if (!opt.use_fp16_arithmetic) opt.use_fp16_uniform = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_overwrite_builtin_layer(layer_type);
#if NCNN_VULKAN
        if (!layer && opt.use_vulkan_compute && d->vkdev)
        {
            layer = create_layer_vulkan(layer_type);
        }
#endif // NCNN_VULKAN
        if (!layer)
        {
            layer = create_layer_cpu(layer_type);
        }
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        int layer_support_vulkan = layer->support_vulkan;

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer_name);
            continue;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer_name);
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        Option opt1 = get_masked_option(opt, layer->featmask);
#if NCNN_VULKAN
        if (opt1.use_vulkan_compute)
        {
            if (!layer->support_image_storage) opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        if (layer_support_vulkan && (!layer->support_vulkan || !opt1.use_vulkan_compute))
        {
            // vulkan layer cannot handle these param, recreate cpu layer
            Layer* layer_cpu = create_overwrite_builtin_layer(layer_type);
            if (!layer_cpu)
            {
                layer_cpu = create_layer_cpu(layer_type);
            }
            if (!layer_cpu)
            {
                layer_cpu = create_custom_layer(layer_type);
            }
            if (!layer_cpu)
            {
                NCNN_LOGE("layer %s not exists or registered", layer_type);
                clear();
                return -1;
            }

            layer_cpu->type = layer->type;
            layer_cpu->name = layer->name;
            layer_cpu->bottoms = layer->bottoms;
            layer_cpu->tops = layer->tops;
            layer_cpu->bottom_shapes = layer->bottom_shapes;
            layer_cpu->top_shapes = layer->top_shapes;
            layer_cpu->featmask = layer->featmask;

            int lr = layer_cpu->load_param(pd);
            if (lr != 0)
            {
                NCNN_LOGE("layer load_param %d %s failed", i, layer_name);
                continue;
            }

            delete layer;
            layer = layer_cpu;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}